

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptArrays.cpp
# Opt level: O3

void __thiscall
GlobOpt::ArraySrcOpt::InsertInstrInLandingPad(ArraySrcOpt *this,Instr *instr,Loop *hoistOutOfLoop)

{
  Instr *instr_00;
  BasicBlock *pBVar1;
  long lVar2;
  Func **ppFVar3;
  
  instr_00 = hoistOutOfLoop->bailOutInfo->bailOutInstr;
  if (instr_00 != (Instr *)0x0) {
    IR::Instr::SetByteCodeOffset(instr,instr_00);
    IR::Instr::InsertBefore(hoistOutOfLoop->bailOutInfo->bailOutInstr,instr);
    return;
  }
  pBVar1 = hoistOutOfLoop->landingPad->next;
  ppFVar3 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar3 = &hoistOutOfLoop->landingPad->func;
  }
  lVar2 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar2 = 0xd0;
  }
  IR::Instr::SetByteCodeOffset(instr,*(Instr **)((long)&(*ppFVar3)->m_alloc + lVar2));
  BasicBlock::InsertAfter(hoistOutOfLoop->landingPad,instr);
  return;
}

Assistant:

void GlobOpt::ArraySrcOpt::InsertInstrInLandingPad(IR::Instr *const instr, Loop *const hoistOutOfLoop)
{
    if (hoistOutOfLoop->bailOutInfo->bailOutInstr)
    {
        instr->SetByteCodeOffset(hoistOutOfLoop->bailOutInfo->bailOutInstr);
        hoistOutOfLoop->bailOutInfo->bailOutInstr->InsertBefore(instr);
    }
    else
    {
        instr->SetByteCodeOffset(hoistOutOfLoop->landingPad->GetLastInstr());
        hoistOutOfLoop->landingPad->InsertAfter(instr);
    }
}